

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

void ZSTD_ldm_fillHashTable(ldmState_t *ldmState,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  uint uVar1;
  U32 UVar2;
  U32 UVar3;
  BYTE *pBVar4;
  size_t sVar5;
  ldmEntry_t entry_00;
  size_t sVar6;
  XXH64_hash_t XVar7;
  ldmEntry_t entry;
  U32 hash;
  U64 xxhash;
  BYTE *split;
  uint n;
  size_t hashed;
  size_t *psStack_58;
  uint numSplits;
  size_t *splits;
  ldmRollingHashState_t hashState;
  BYTE *istart;
  BYTE *base;
  U32 hBits;
  U32 minMatchLength;
  ldmParams_t *params_local;
  BYTE *iend_local;
  BYTE *ip_local;
  ldmState_t *ldmState_local;
  
  uVar1 = params->minMatchLength;
  UVar2 = params->hashLog;
  UVar3 = params->bucketSizeLog;
  pBVar4 = (ldmState->window).base;
  psStack_58 = ldmState->splitIndices;
  hashState.stopMask = (U64)ip;
  ZSTD_ldm_gear_init((ldmRollingHashState_t *)&splits,params);
  for (iend_local = ip; iend_local < iend; iend_local = iend_local + sVar6) {
    hashed._4_4_ = 0;
    sVar6 = ZSTD_ldm_gear_feed((ldmRollingHashState_t *)&splits,iend_local,
                               (long)iend - (long)iend_local,psStack_58,(uint *)((long)&hashed + 4))
    ;
    for (split._4_4_ = 0; split._4_4_ < hashed._4_4_; split._4_4_ = split._4_4_ + 1) {
      if ((BYTE *)(hashState.stopMask + uVar1) <= iend_local + psStack_58[split._4_4_]) {
        sVar5 = psStack_58[split._4_4_];
        XVar7 = ZSTD_XXH64(iend_local + (sVar5 - uVar1),(ulong)uVar1,0);
        entry_00.checksum = (U32)(XVar7 >> 0x20);
        entry_00.offset = (int)(iend_local + (sVar5 - uVar1)) - (int)pBVar4;
        ZSTD_ldm_insertEntry
                  (ldmState,(ulong)((uint)XVar7 & (1 << ((char)UVar2 - (char)UVar3 & 0x1fU)) - 1U),
                   entry_00,*params);
      }
    }
  }
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* ldmState, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U32 const minMatchLength = params->minMatchLength;
    U32 const hBits = params->hashLog - params->bucketSizeLog;
    BYTE const* const base = ldmState->window.base;
    BYTE const* const istart = ip;
    ldmRollingHashState_t hashState;
    size_t* const splits = ldmState->splitIndices;
    unsigned numSplits;

    DEBUGLOG(5, "ZSTD_ldm_fillHashTable");

    ZSTD_ldm_gear_init(&hashState, params);
    while (ip < iend) {
        size_t hashed;
        unsigned n;

        numSplits = 0;
        hashed = ZSTD_ldm_gear_feed(&hashState, ip, iend - ip, splits, &numSplits);

        for (n = 0; n < numSplits; n++) {
            if (ip + splits[n] >= istart + minMatchLength) {
                BYTE const* const split = ip + splits[n] - minMatchLength;
                U64 const xxhash = XXH64(split, minMatchLength, 0);
                U32 const hash = (U32)(xxhash & (((U32)1 << hBits) - 1));
                ldmEntry_t entry;

                entry.offset = (U32)(split - base);
                entry.checksum = (U32)(xxhash >> 32);
                ZSTD_ldm_insertEntry(ldmState, hash, entry, *params);
            }
        }

        ip += hashed;
    }
}